

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_False_Test::Body
          (iu_SyntaxTest_x_iutest_x_False_Test *this)

{
  AssertionResult iutest_ar_3;
  bool b_3;
  AssertionResult iutest_ar_2;
  bool b_2;
  AssertionResult iutest_ar_1;
  bool b_1;
  AssertionResult iutest_ar;
  bool b;
  iu_SyntaxTest_x_iutest_x_False_Test *this_local;
  
  return;
}

Assistant:

IUTEST(SyntaxTest, False)
{
    if( bool b = false )
        IUTEST_ASSERT_FALSE(b) << b;
    if( bool b = false )
        IUTEST_EXPECT_FALSE(b) << b;
    if( bool b = false )
        IUTEST_INFORM_FALSE(b) << b;
    if( bool b = false )
        IUTEST_ASSUME_FALSE(b) << b;
}